

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<int_*const_&,_const_long_&>::streamReconstructedExpression
          (BinaryExpr<int_*const_&,_const_long_&> *this,ostream *os)

{
  StringRef SVar1;
  int **in_RDX;
  string local_60;
  string local_40;
  
  Detail::stringify<int*>(&local_40,(Detail *)this->m_lhs,in_RDX);
  SVar1 = this->m_op;
  Detail::stringify<long>(&local_60,this->m_rhs);
  Catch::formatReconstructedExpression(os,(string *)&local_40,SVar1,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }